

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorpickermenu.cpp
# Opt level: O2

DMenu * StartPickerMenu(DMenu *parent,char *name,FColorCVar *cvar)

{
  FMenuDescriptor **ppFVar1;
  DColorPickerMenu *this;
  FName local_2c;
  
  local_2c.Index = 0x20f;
  ppFVar1 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
            CheckKey(&MenuDescriptors,&local_2c);
  if ((ppFVar1 == (FMenuDescriptor **)0x0) || ((*ppFVar1)->mType != 1)) {
    this = (DColorPickerMenu *)0x0;
  }
  else {
    this = (DColorPickerMenu *)DObject::operator_new(0x68);
    DColorPickerMenu::DColorPickerMenu(this,parent,name,(FOptionMenuDescriptor *)*ppFVar1,cvar);
  }
  return (DMenu *)this;
}

Assistant:

DMenu *StartPickerMenu(DMenu *parent, const char *name, FColorCVar *cvar)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_Colorpickermenu);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		return new DColorPickerMenu(parent, name, (FOptionMenuDescriptor*)(*desc), cvar);
	}
	else
	{
		return NULL;
	}
}